

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PololuInterface.cpp
# Opt level: O0

void * PololuInterfaceThread(void *pParam)

{
  bool bVar1;
  int iVar2;
  BOOL bConnected;
  void *pParam_local;
  
  if ((szPololuInterfacePath[0] == ':') && (iVar2 = atoi(szPololuInterfacePath + 1), 0 < iVar2)) {
    PololuInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar2 = LaunchMultiCliTCPSrv(szPololuInterfacePath + 1,handlepololuinterfacecli,(void *)0x0);
      if (iVar2 == 0) break;
      printf("Error launching the PololuInterface server.\n");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar2 = handlepololuinterface(&PololuInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          printf("Connection to a PololuInterface lost.\n");
          bVar1 = false;
          disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
          uSleep(50000);
        }
      }
      else {
        iVar2 = connectpololuinterface(&PololuInterfacePseudoRS232Port);
        if (iVar2 != 0) {
          mSleep(1000);
        }
        else {
          uSleep(50000);
          inithandlepololuinterface(&PololuInterfacePseudoRS232Port);
        }
        bVar1 = iVar2 == 0;
      }
    } while (bExit == 0);
    if (bVar1) {
      disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
    }
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE PololuInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(pololuinterfacefilename, LOG_FOLDER"pololuinterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//pololuinterfacefile = fopen(pololuinterfacefilename, "w");
	//if (pololuinterfacefile == NULL)
	//{
	//	printf("Unable to create pololuinterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szPololuInterfacePath[0] == ':')&&(atoi(szPololuInterfacePath+1) > 0))
	{
		PololuInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szPololuInterfacePath+1, handlepololuinterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the PololuInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*50);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("PololuInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectpololuinterface(&PololuInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*50);
					bConnected = TRUE; 

					inithandlepololuinterface(&PololuInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlepololuinterface(&PololuInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a PololuInterface lost.\n");
					bConnected = FALSE;
					disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
					uSleep(1000*50);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectpololuinterface(&PololuInterfacePseudoRS232Port);
	}

	//fclose(pololuinterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}